

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typechecking.cc
# Opt level: O0

void __thiscall
tchecker::details::statement_typechecker_t::visit
          (statement_typechecker_t *this,local_array_statement_t *stmt)

{
  integer_variables_t *piVar1;
  clock_variables_t *pcVar2;
  long lVar3;
  bool bVar4;
  expression_type_t type;
  var_expression_t *pvVar5;
  string *psVar6;
  expression_t *peVar7;
  element_type *peVar8;
  shared_ptr<tchecker::typed_local_array_statement_t> local_1c0;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1b0;
  shared_ptr<tchecker::typed_expression_t> local_190;
  undefined1 local_180 [8];
  shared_ptr<const_tchecker::typed_var_expression_t> variable;
  int local_12c;
  shared_ptr<tchecker::typed_int_expression_t> local_128;
  intvar_id_t local_114;
  undefined1 local_110 [4];
  integer_t size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_90;
  shared_ptr<tchecker::typed_expression_t> local_60;
  undefined1 local_50 [8];
  shared_ptr<const_tchecker::typed_expression_t> szexpr;
  string name;
  statement_type_t stmt_type;
  local_array_statement_t *stmt_local;
  statement_typechecker_t *this_local;
  
  name.field_2._12_4_ = 0;
  pvVar5 = local_array_statement_t::variable(stmt);
  psVar6 = var_expression_t::name_abi_cxx11_(pvVar5);
  std::__cxx11::string::string
            ((string *)
             &szexpr.
              super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(string *)psVar6);
  peVar7 = local_array_statement_t::size(stmt);
  piVar1 = this->_intvars;
  pcVar2 = this->_clocks;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_90,&this->_error);
  typecheck((tchecker *)&local_60,peVar7,&this->_localvars,piVar1,pcVar2,&local_90);
  std::shared_ptr<tchecker::typed_expression_t_const>::shared_ptr<tchecker::typed_expression_t,void>
            ((shared_ptr<tchecker::typed_expression_t_const> *)local_50,&local_60);
  std::shared_ptr<tchecker::typed_expression_t>::~shared_ptr(&local_60);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_90);
  peVar8 = std::
           __shared_ptr_access<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
  type = typed_expression_t::type(peVar8);
  bVar4 = integer_valued(type);
  if (bVar4) {
    bVar4 = variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::is_variable((variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&this->_localvars,
                          (string *)
                          &szexpr.
                           super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount);
    if (bVar4) {
      std::operator+(&local_f0,"local variable already exists: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &szexpr.
                      super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(&this->_error,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
    }
    else {
      bVar4 = variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::is_variable((variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)this->_intvars,
                            (string *)
                            &szexpr.
                             super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount);
      if (bVar4) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_110,"local variable already exists as a global one: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &szexpr.
                        super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
        std::
        function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::operator()(&this->_error,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110)
        ;
        std::__cxx11::string::~string((string *)local_110);
      }
      else {
        peVar7 = local_array_statement_t::size(stmt);
        local_114 = const_evaluate(peVar7);
        name.field_2._12_4_ = 10;
        local_12c = 1;
        std::make_shared<tchecker::typed_int_expression_t,tchecker::expression_type_t,int&>
                  ((expression_type_t *)&local_128,&local_12c);
        std::shared_ptr<tchecker::typed_expression_t_const>::operator=
                  ((shared_ptr<tchecker::typed_expression_t_const> *)local_50,&local_128);
        std::shared_ptr<tchecker::typed_int_expression_t>::~shared_ptr(&local_128);
        integer_variables_t::declare
                  (&this->_localvars,
                   (string *)
                   &szexpr.
                    super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,local_114,-0x80000000,0x7fffffff,0);
      }
    }
  }
  else {
    peVar8 = std::
             __shared_ptr_access<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_50);
    expression_t::to_string_abi_cxx11_
              (&local_d0,(expression_t *)(&peVar8->field_0x0 + *(long *)(*(long *)peVar8 + -0x38)));
    std::operator+(&local_b0,"array size is not an integer: ",&local_d0);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(&this->_error,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  pvVar5 = local_array_statement_t::variable(stmt);
  lVar3 = *(long *)(*(long *)pvVar5 + -0x38);
  piVar1 = this->_intvars;
  pcVar2 = this->_clocks;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_1b0,&this->_error);
  typecheck((tchecker *)&local_190,(expression_t *)(&pvVar5->field_0x0 + lVar3),&this->_localvars,
            piVar1,pcVar2,&local_1b0);
  std::dynamic_pointer_cast<tchecker::typed_var_expression_t_const,tchecker::typed_expression_t>
            ((shared_ptr<tchecker::typed_expression_t> *)local_180);
  std::shared_ptr<tchecker::typed_expression_t>::~shared_ptr(&local_190);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1b0);
  std::
  make_shared<tchecker::typed_local_array_statement_t,tchecker::statement_type_t&,std::shared_ptr<tchecker::typed_var_expression_t_const>&,std::shared_ptr<tchecker::typed_expression_t_const>&>
            ((statement_type_t *)&local_1c0,
             (shared_ptr<const_tchecker::typed_var_expression_t> *)((long)&name.field_2 + 0xc),
             (shared_ptr<const_tchecker::typed_expression_t> *)local_180);
  std::shared_ptr<tchecker::typed_statement_t>::operator=(&this->_typed_stmt,&local_1c0);
  std::shared_ptr<tchecker::typed_local_array_statement_t>::~shared_ptr(&local_1c0);
  std::shared_ptr<const_tchecker::typed_var_expression_t>::~shared_ptr
            ((shared_ptr<const_tchecker::typed_var_expression_t> *)local_180);
  std::shared_ptr<const_tchecker::typed_expression_t>::~shared_ptr
            ((shared_ptr<const_tchecker::typed_expression_t> *)local_50);
  std::__cxx11::string::~string
            ((string *)
             &szexpr.
              super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

virtual void visit(tchecker::local_array_statement_t const & stmt)
  {
    enum tchecker::statement_type_t stmt_type = tchecker::STMT_TYPE_BAD;

    std::string name = stmt.variable().name();
    std::shared_ptr<tchecker::typed_expression_t const> szexpr{
        tchecker::typecheck(stmt.size(), _localvars, _intvars, _clocks, _error)};

    if (!integer_valued(szexpr->type())) {
      _error("array size is not an integer: " + szexpr->to_string());
    }
    else if (_localvars.is_variable(name)) {
      _error("local variable already exists: " + name);
    }
    else if (_intvars.is_variable(name)) {
      _error("local variable already exists as a global one: " + name);
    }
    else {
      try {
        auto size = tchecker::const_evaluate(stmt.size());
        stmt_type = tchecker::STMT_TYPE_LOCAL_ARRAY;
        szexpr = std::make_shared<tchecker::typed_int_expression_t>(EXPR_TYPE_INTTERM, size);
        _localvars.declare(name, size, tchecker::int_minval, tchecker::int_maxval, 0);
      }
      catch (...) {
        _error("can't compute array size:" + stmt.to_string());
      }
    }
    auto variable = std::dynamic_pointer_cast<tchecker::typed_var_expression_t const>(
        tchecker::typecheck(stmt.variable(), _localvars, _intvars, _clocks, _error));
    _typed_stmt = std::make_shared<tchecker::typed_local_array_statement_t>(stmt_type, variable, szexpr);
  }